

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

double __thiscall ON_PlaneEquation::MaximumValueAt(ON_PlaneEquation *this,ON_BoundingBox *bbox)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  
  auVar2._0_8_ = (bbox->m_min).x * this->x;
  auVar2._8_8_ = (bbox->m_min).y * this->y;
  auVar3._8_8_ = (bbox->m_max).y * this->y;
  auVar3._0_8_ = (bbox->m_max).x * this->x;
  auVar3 = maxpd(auVar2,auVar3);
  dVar4 = (bbox->m_min).z * this->z;
  dVar1 = this->z * (bbox->m_max).z;
  if (dVar4 <= dVar1) {
    dVar4 = dVar1;
  }
  return auVar3._8_8_ + auVar3._0_8_ + dVar4 + this->d;
}

Assistant:

double ON_PlaneEquation::MaximumValueAt(const ON_BoundingBox& bbox) const
{
  double xx, yy, zz, s;

  s = x*bbox.m_min.x;
  if ( s > (xx = x*bbox.m_max.x) ) xx = s;

  s = y*bbox.m_min.y;
  if ( s > (yy = y*bbox.m_max.y) ) yy = s;

  s = z*bbox.m_min.z;
  if ( s > (zz = z*bbox.m_max.z) ) zz = s;

  return (xx + yy + zz + d);
}